

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeOp * sqlite3VdbeGetOp(Vdbe *p,int addr)

{
  int local_1c;
  int addr_local;
  Vdbe *p_local;
  
  local_1c = addr;
  if (addr < 0) {
    local_1c = p->nOp + -1;
  }
  if (p->db->mallocFailed == '\0') {
    p_local = (Vdbe *)(p->aOp + local_1c);
  }
  else {
    p_local = (Vdbe *)&sqlite3VdbeGetOp::dummy;
  }
  return (VdbeOp *)p_local;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeGetOp(Vdbe *p, int addr){
  /* C89 specifies that the constant "dummy" will be initialized to all
  ** zeros, which is correct.  MSVC generates a warning, nevertheless. */
  static VdbeOp dummy;  /* Ignore the MSVC warning about no initializer */
  assert( p->magic==VDBE_MAGIC_INIT );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  assert( (addr>=0 && addr<p->nOp) || p->db->mallocFailed );
  if( p->db->mallocFailed ){
    return (VdbeOp*)&dummy;
  }else{
    return &p->aOp[addr];
  }
}